

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__free_jpeg_components(stbi__jpeg *z,int ncomp,int why)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    if (*(long *)(in_RDI + (long)local_14 * 0x60 + 0x46d8) != 0) {
      free(*(void **)(in_RDI + (long)local_14 * 0x60 + 0x46d8));
      *(undefined8 *)(in_RDI + (long)local_14 * 0x60 + 0x46d8) = 0;
      *(undefined8 *)(in_RDI + (long)local_14 * 0x60 + 0x46d0) = 0;
    }
    if (*(long *)(in_RDI + (long)local_14 * 0x60 + 0x46e0) != 0) {
      free(*(void **)(in_RDI + (long)local_14 * 0x60 + 0x46e0));
      *(undefined8 *)(in_RDI + (long)local_14 * 0x60 + 0x46e0) = 0;
      *(undefined8 *)(in_RDI + (long)local_14 * 0x60 + 0x46f0) = 0;
    }
    if (*(long *)(in_RDI + (long)local_14 * 0x60 + 0x46e8) != 0) {
      free(*(void **)(in_RDI + (long)local_14 * 0x60 + 0x46e8));
      *(undefined8 *)(in_RDI + (long)local_14 * 0x60 + 0x46e8) = 0;
    }
  }
  return in_EDX;
}

Assistant:

static int stbi__free_jpeg_components(stbi__jpeg *z, int ncomp, int why)
{
   int i;
   for (i=0; i < ncomp; ++i) {
      if (z->img_comp[i].raw_data) {
         STBI_FREE(z->img_comp[i].raw_data);
         z->img_comp[i].raw_data = NULL;
         z->img_comp[i].data = NULL;
      }
      if (z->img_comp[i].raw_coeff) {
         STBI_FREE(z->img_comp[i].raw_coeff);
         z->img_comp[i].raw_coeff = 0;
         z->img_comp[i].coeff = 0;
      }
      if (z->img_comp[i].linebuf) {
         STBI_FREE(z->img_comp[i].linebuf);
         z->img_comp[i].linebuf = NULL;
      }
   }
   return why;
}